

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  uint uVar1;
  fpclass_type fVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int32_t iVar5;
  bool bVar6;
  uint uVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int *piVar17;
  int *piVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  int iVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  double a;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint local_3d8 [3];
  undefined3 uStack_3cb;
  int iStack_3c8;
  bool bStack_3c4;
  undefined8 local_3c0;
  int *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  ulong local_3a0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_398;
  long local_390;
  int *local_388;
  pointer local_380;
  int *local_378;
  int *local_370;
  int *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  int *local_358;
  int *local_350;
  cpp_dec_float<200U,_int,_void> local_348;
  int *local_2c0;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar29 = 0;
  local_348.fpclass = cpp_dec_float_finite;
  local_348.prec_elem = 0x1c;
  local_348.data._M_elems[0] = 0;
  local_348.data._M_elems[1] = 0;
  local_348.data._M_elems[2] = 0;
  local_348.data._M_elems[3] = 0;
  local_348.data._M_elems[4] = 0;
  local_348.data._M_elems[5] = 0;
  local_348.data._M_elems[6] = 0;
  local_348.data._M_elems[7] = 0;
  local_348.data._M_elems[8] = 0;
  local_348.data._M_elems[9] = 0;
  local_348.data._M_elems[10] = 0;
  local_348.data._M_elems[0xb] = 0;
  local_348.data._M_elems[0xc] = 0;
  local_348.data._M_elems[0xd] = 0;
  local_348.data._M_elems[0xe] = 0;
  local_348.data._M_elems[0xf] = 0;
  local_348.data._M_elems[0x10] = 0;
  local_348.data._M_elems[0x11] = 0;
  local_348.data._M_elems[0x12] = 0;
  local_348.data._M_elems[0x13] = 0;
  local_348.data._M_elems[0x14] = 0;
  local_348.data._M_elems[0x15] = 0;
  local_348.data._M_elems[0x16] = 0;
  local_348.data._M_elems[0x17] = 0;
  local_348.data._M_elems[0x18] = 0;
  local_348.data._M_elems[0x19] = 0;
  local_348.data._M_elems._104_5_ = 0;
  uVar27 = 0;
  local_348.data._M_elems[0x1b]._1_3_ = 0;
  local_348.exp = 0;
  local_348.neg = false;
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x1c;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems[0xe] = 0;
  local_2b8.data._M_elems[0xf] = 0;
  local_2b8.data._M_elems[0x10] = 0;
  local_2b8.data._M_elems[0x11] = 0;
  local_2b8.data._M_elems[0x12] = 0;
  local_2b8.data._M_elems[0x13] = 0;
  local_2b8.data._M_elems[0x14] = 0;
  local_2b8.data._M_elems[0x15] = 0;
  local_2b8.data._M_elems[0x16] = 0;
  local_2b8.data._M_elems[0x17] = 0;
  local_2b8.data._M_elems[0x18] = 0;
  local_2b8.data._M_elems[0x19] = 0;
  local_2b8.data._M_elems._104_5_ = 0;
  local_2b8.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  if (0 < rn) {
    piVar17 = (this->row).orig;
    local_2c0 = (this->row).perm;
    local_368 = (this->col).orig;
    local_378 = (this->u).col.idx;
    local_380 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_370 = (this->u).col.len;
    local_388 = (this->u).col.start;
    uVar27 = 0;
    local_3b0 = piVar17;
    local_3a8 = rhs;
    local_398 = this;
    local_360 = vec;
    local_358 = vidx;
    local_350 = ridx;
    do {
      local_390 = (long)*ridx;
      local_43c = rn - 1;
      iVar12 = ridx[(long)rn + -1];
      iVar10 = 1;
      iVar13 = 0;
      if (3 < rn) {
        iVar13 = 0;
        do {
          iVar11 = ridx[iVar10];
          iVar24 = ridx[(long)iVar10 + 1];
          piVar18 = ridx + iVar13;
          if (iVar24 < iVar11) {
            iVar13 = iVar10;
            iVar24 = iVar11;
            if (iVar11 <= iVar12) goto LAB_0053e661;
          }
          else {
            if (iVar24 <= iVar12) goto LAB_0053e661;
            iVar13 = iVar10 + 1;
          }
          *piVar18 = iVar24;
          iVar10 = iVar13 * 2 + 1;
        } while (iVar10 < (int)(rn - 2U));
      }
      if ((iVar10 < (int)local_43c) && (iVar12 < ridx[iVar10])) {
        ridx[iVar13] = ridx[iVar10];
        iVar13 = iVar10;
      }
      piVar18 = ridx + iVar13;
LAB_0053e661:
      *piVar18 = iVar12;
      pcVar22 = &local_3a8[piVar17[local_390]].m_backend;
      pcVar26 = &(local_398->diag).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[piVar17[local_390]].m_backend;
      local_3c0._0_4_ = cpp_dec_float_finite;
      local_3c0._4_4_ = 0x1c;
      local_438 = ZEXT816(0);
      local_428 = ZEXT816(0);
      local_418 = ZEXT816(0);
      local_408 = ZEXT816(0);
      local_3f8 = ZEXT816(0);
      local_3e8 = ZEXT816(0);
      local_3d8[0] = 0;
      local_3d8[1] = 0;
      stack0xfffffffffffffc30 = 0;
      uStack_3cb = 0;
      iStack_3c8 = 0;
      bStack_3c4 = false;
      pcVar23 = pcVar26;
      if (((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar22) &&
         (pcVar23 = pcVar22, (cpp_dec_float<200U,_int,_void> *)local_438 != pcVar26)) {
        pcVar20 = pcVar26;
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar25->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar29 * -8 + 4);
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar29 * -8 + 4);
        }
        iStack_3c8 = pcVar26->exp;
        bStack_3c4 = pcVar26->neg;
        local_3c0._0_4_ = pcVar26->fpclass;
        local_3c0._4_4_ = pcVar26->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar23);
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_438;
      pcVar26 = &local_348;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4);
      }
      local_348.exp = iStack_3c8;
      local_348.neg = bStack_3c4;
      local_348.fpclass = (fpclass_type)local_3c0;
      local_348.prec_elem = local_3c0._4_4_;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar22,0);
      pcVar22 = &local_348;
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_438;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar23->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4);
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4);
      }
      pnVar21 = eps;
      pcVar22 = &local_b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar22->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_b0.exp = (eps->m_backend).exp;
      local_b0.neg = (eps->m_backend).neg;
      local_b0.fpclass = (eps->m_backend).fpclass;
      local_b0.prec_elem = (eps->m_backend).prec_elem;
      iStack_3c8 = local_348.exp;
      bStack_3c4 = local_348.neg;
      local_3c0._0_4_ = local_348.fpclass;
      local_3c0._4_4_ = local_348.prec_elem;
      if ((local_348.neg == true) &&
         (local_438._0_4_ != 0 || local_348.fpclass != cpp_dec_float_finite)) {
        bStack_3c4 = false;
      }
      if ((local_b0.fpclass != cpp_dec_float_NaN && local_348.fpclass != cpp_dec_float_NaN) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_438,&local_b0), 0 < iVar10)) {
        iVar10 = local_368[local_390];
        local_3a0 = uVar27;
        local_358[(int)uVar27] = iVar10;
        pcVar22 = &local_348;
        pnVar21 = local_360 + iVar10;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar29 * -2 + 1) * 4)
          ;
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_360[iVar10].m_backend.exp = local_348.exp;
        local_360[iVar10].m_backend.neg = local_348.neg;
        local_360[iVar10].m_backend.fpclass = local_348.fpclass;
        local_360[iVar10].m_backend.prec_elem = local_348.prec_elem;
        if (0 < local_370[iVar10]) {
          piVar17 = local_378 + local_388[iVar10];
          pcVar22 = &local_380[local_388[iVar10]].m_backend;
          iVar10 = local_370[iVar10];
          do {
            iVar12 = *piVar17;
            pnVar21 = local_3a8 + iVar12;
            pnVar19 = pnVar21;
            pcVar23 = &local_2b8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar23->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar23 + ((ulong)bVar29 * -2 + 1) * 4);
            }
            local_2b8.exp = local_3a8[iVar12].m_backend.exp;
            local_2b8.neg = local_3a8[iVar12].m_backend.neg;
            fVar2 = local_3a8[iVar12].m_backend.fpclass;
            iVar4 = local_3a8[iVar12].m_backend.prec_elem;
            local_2b8.fpclass = fVar2;
            local_2b8.prec_elem = iVar4;
            if (fVar2 == cpp_dec_float_NaN) {
LAB_0053e985:
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = (undefined1  [16])0x0;
              local_428 = (undefined1  [16])0x0;
              local_418 = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3f8 = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              pcVar23 = &local_348;
              if ((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar22) {
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar29 * -8 + 4);
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar29 * -8 + 4);
                }
                iStack_3c8 = local_348.exp;
                bStack_3c4 = local_348.neg;
                local_3c0._0_4_ = local_348.fpclass;
                local_3c0._4_4_ = local_348.prec_elem;
                pcVar23 = pcVar22;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar23);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_2b8,(cpp_dec_float<200U,_int,_void> *)local_438);
              a = 0.0;
              if (local_2b8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_438,0,(type *)0x0);
                iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_2b8,(cpp_dec_float<200U,_int,_void> *)local_438);
                a = 1e-100;
                if (iVar12 != 0) {
                  a = 0.0;
                }
              }
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = ZEXT816(0);
              local_428 = ZEXT816(0);
              local_418 = ZEXT816(0);
              local_408 = ZEXT816(0);
              local_3f8 = ZEXT816(0);
              local_3e8 = ZEXT816(0);
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_438,a);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_2b8,(cpp_dec_float<200U,_int,_void> *)local_438);
              pcVar23 = &local_2b8;
              pnVar19 = pnVar21;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar19->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              (pnVar21->m_backend).exp = local_2b8.exp;
              (pnVar21->m_backend).neg = local_2b8.neg;
              (pnVar21->m_backend).fpclass = local_2b8.fpclass;
              (pnVar21->m_backend).prec_elem = local_2b8.prec_elem;
              ridx = local_350;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_438,0,(type *)0x0);
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_2b8,(cpp_dec_float<200U,_int,_void> *)local_438);
              iVar13 = local_348.exp;
              if (iVar11 != 0) goto LAB_0053e985;
              pcVar23 = &local_348;
              pcVar26 = &local_230;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar26 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_230.exp = local_348.exp;
              local_230.neg = local_348.neg;
              fVar8 = local_348.fpclass;
              local_230.fpclass = local_348.fpclass;
              iVar9 = local_348.prec_elem;
              local_230.prec_elem = local_348.prec_elem;
              if (local_230.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite) {
                local_230.neg = (bool)(local_348.neg ^ 1);
              }
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = (undefined1  [16])0x0;
              local_428 = (undefined1  [16])0x0;
              local_418 = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3f8 = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              pcVar23 = &local_230;
              if ((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar22) {
                pcVar23 = &local_348;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar29 * -8 + 4);
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar29 * -8 + 4);
                }
                iStack_3c8 = iVar13;
                bStack_3c4 = local_230.neg;
                local_3c0._0_4_ = fVar8;
                local_3c0._4_4_ = iVar9;
                pcVar23 = pcVar22;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar23);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_438;
              pcVar26 = &local_2b8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_2b8.exp = iStack_3c8;
              local_2b8.neg = bStack_3c4;
              local_2b8.fpclass = (fpclass_type)local_3c0;
              local_2b8.prec_elem = local_3c0._4_4_;
              pcVar23 = &local_2b8;
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_438;
              for (lVar14 = 0x1c; ridx = local_350, lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4)
                ;
              }
              pnVar19 = eps;
              pcVar23 = &local_130;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar23->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
                pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar23 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_130.exp = (eps->m_backend).exp;
              local_130.neg = (eps->m_backend).neg;
              fVar3 = (eps->m_backend).fpclass;
              iVar5 = (eps->m_backend).prec_elem;
              local_130.fpclass = fVar3;
              local_130.prec_elem = iVar5;
              if ((bStack_3c4 == true) &&
                 (local_438._0_4_ != 0 || (fpclass_type)local_3c0 != cpp_dec_float_finite)) {
                bStack_3c4 = false;
              }
              if ((fVar3 != cpp_dec_float_NaN && (fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
                 (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_438,&local_130),
                 0 < iVar13)) {
                pcVar23 = &local_2b8;
                pnVar19 = pnVar21;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pnVar19->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + ((ulong)bVar29 * -2 + 1) * 4);
                  pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar19 + ((ulong)bVar29 * -2 + 1) * 4);
                }
                (pnVar21->m_backend).exp = local_2b8.exp;
                (pnVar21->m_backend).neg = local_2b8.neg;
                (pnVar21->m_backend).fpclass = local_2b8.fpclass;
                (pnVar21->m_backend).prec_elem = local_2b8.prec_elem;
                iVar12 = local_2c0[iVar12];
                uVar16 = local_43c;
                if (0 < (int)local_43c) {
                  do {
                    uVar1 = uVar16 - 1;
                    uVar7 = uVar1 >> 1;
                    if (iVar12 <= ridx[uVar7]) break;
                    ridx[uVar16] = ridx[uVar7];
                    uVar16 = uVar7;
                  } while (1 < uVar1);
                }
                local_43c = local_43c + 1;
                ridx[(int)uVar16] = iVar12;
              }
            }
            piVar17 = piVar17 + 1;
            pcVar22 = pcVar22 + 1;
            bVar6 = 1 < iVar10;
            iVar10 = iVar10 + -1;
          } while (bVar6);
        }
        uVar27 = (ulong)((int)local_3a0 + 1);
        piVar17 = local_3b0;
        if ((double)(int)local_390 * 0.2 < (double)(int)local_43c) {
          if (-1 < (long)*ridx) {
            lVar14 = (long)*ridx;
            do {
              pcVar22 = &local_3a8[piVar17[lVar14]].m_backend;
              pcVar26 = &(local_398->diag).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[piVar17[lVar14]].m_backend;
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = ZEXT816(0);
              local_428 = ZEXT816(0);
              local_418 = ZEXT816(0);
              local_408 = ZEXT816(0);
              local_3f8 = ZEXT816(0);
              local_3e8 = ZEXT816(0);
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              pcVar23 = pcVar26;
              if (((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar22) &&
                 (pcVar23 = pcVar22, (cpp_dec_float<200U,_int,_void> *)local_438 != pcVar26)) {
                pcVar20 = pcVar26;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
                  pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar20 + (ulong)bVar29 * -8 + 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar29 * -8 + 4);
                }
                iStack_3c8 = pcVar26->exp;
                bStack_3c4 = pcVar26->neg;
                local_3c0._0_4_ = pcVar26->fpclass;
                local_3c0._4_4_ = pcVar26->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar23);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_438;
              pcVar26 = &local_348;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_348.exp = iStack_3c8;
              local_348.neg = bStack_3c4;
              local_348.fpclass = (fpclass_type)local_3c0;
              local_348.prec_elem = local_3c0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar22,0);
              pcVar22 = &local_348;
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_438;
              for (lVar15 = 0x1c; piVar17 = local_3b0, lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar29 * -8 + 4)
                ;
              }
              pnVar21 = eps;
              pcVar22 = &local_1b0;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar22->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
                pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_1b0.exp = (eps->m_backend).exp;
              local_1b0.neg = (eps->m_backend).neg;
              local_1b0.fpclass = (eps->m_backend).fpclass;
              local_1b0.prec_elem = (eps->m_backend).prec_elem;
              iStack_3c8 = local_348.exp;
              bStack_3c4 = local_348.neg;
              local_3c0._0_4_ = local_348.fpclass;
              local_3c0._4_4_ = local_348.prec_elem;
              if ((local_348.neg == true) &&
                 (local_438._0_4_ != 0 || local_348.fpclass != cpp_dec_float_finite)) {
                bStack_3c4 = false;
              }
              if ((local_1b0.fpclass != cpp_dec_float_NaN && local_348.fpclass != cpp_dec_float_NaN)
                 && (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare((cpp_dec_float<200U,_int,_void> *)local_438,&local_1b0),
                    0 < iVar10)) {
                iVar10 = local_368[lVar14];
                uVar28 = (ulong)((int)uVar27 + 1);
                local_358[(int)uVar27] = iVar10;
                pcVar22 = &local_348;
                pnVar21 = local_360 + iVar10;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pnVar21->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar29 * -8 + 4);
                  pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar21 + ((ulong)bVar29 * -2 + 1) * 4);
                }
                local_360[iVar10].m_backend.exp = local_348.exp;
                local_360[iVar10].m_backend.neg = local_348.neg;
                local_360[iVar10].m_backend.fpclass = local_348.fpclass;
                local_360[iVar10].m_backend.prec_elem = local_348.prec_elem;
                uVar27 = uVar28;
                if (0 < local_370[iVar10]) {
                  local_3a0 = uVar28;
                  piVar18 = local_378 + local_388[iVar10];
                  pcVar22 = &local_380[local_388[iVar10]].m_backend;
                  iVar10 = local_370[iVar10] + 1;
                  do {
                    local_3c0._0_4_ = cpp_dec_float_finite;
                    local_3c0._4_4_ = 0x1c;
                    local_438 = (undefined1  [16])0x0;
                    local_428 = (undefined1  [16])0x0;
                    local_418 = (undefined1  [16])0x0;
                    local_408 = (undefined1  [16])0x0;
                    local_3f8 = (undefined1  [16])0x0;
                    local_3e8 = (undefined1  [16])0x0;
                    local_3d8[0] = 0;
                    local_3d8[1] = 0;
                    stack0xfffffffffffffc30 = 0;
                    uStack_3cb = 0;
                    iStack_3c8 = 0;
                    bStack_3c4 = false;
                    pcVar23 = &local_348;
                    if (pcVar22 != (cpp_dec_float<200U,_int,_void> *)local_438) {
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_438;
                      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                        (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                        pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar23 + (ulong)bVar29 * -8 + 4);
                        pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar26 + (ulong)bVar29 * -8 + 4);
                      }
                      iStack_3c8 = local_348.exp;
                      bStack_3c4 = local_348.neg;
                      local_3c0._0_4_ = local_348.fpclass;
                      local_3c0._4_4_ = local_348.prec_elem;
                      pcVar23 = pcVar22;
                    }
                    pcVar22 = pcVar22 + 1;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                              ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar23);
                    iVar12 = *piVar18;
                    piVar18 = piVar18 + 1;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (&local_3a8[iVar12].m_backend,
                               (cpp_dec_float<200U,_int,_void> *)local_438);
                    iVar10 = iVar10 + -1;
                    piVar17 = local_3b0;
                    uVar27 = local_3a0;
                  } while (1 < iVar10);
                }
              }
              bVar6 = 0 < lVar14;
              lVar14 = lVar14 + -1;
            } while (bVar6);
          }
          break;
        }
      }
      rn = local_43c;
    } while (0 < (int)local_43c);
  }
  return (int)uVar27;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}